

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcSpace::~IfcSpace(IfcSpace *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject =
       0x91caa0;
  *(undefined8 *)&this->field_0x198 = 0x91cb90;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x91cac8;
  (this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x91caf0;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x91cb18;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.field_0x100 = 0x91cb40;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).field_0x158 = 0x91cb68;
  puVar1 = *(undefined1 **)&(this->super_IfcSpatialStructureElement).field_0x168;
  if (puVar1 != &this->field_0x178) {
    operator_delete(puVar1);
  }
  IfcSpatialStructureElement::~IfcSpatialStructureElement
            (&this->super_IfcSpatialStructureElement,&PTR_construction_vtable_24__0091cba8);
  operator_delete(this);
  return;
}

Assistant:

IfcSpace() : Object("IfcSpace") {}